

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_Tt7IsopCover(word *uOn,word *uOnDc,int nVars,word *uRes,int *pCover,int *pnCubes)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  word wVar4;
  word wVar5;
  word wVar6;
  ulong uVar7;
  undefined4 in_register_00000014;
  word *pwVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  pwVar8 = (word *)CONCAT44(in_register_00000014,nVars);
  wVar4 = *uOn;
  if (wVar4 == uOn[1]) {
    wVar5 = *uOnDc;
    uVar7 = uOnDc[1];
    if (wVar5 == uVar7) {
      wVar4 = Abc_Tt6IsopCover(wVar4,wVar5,6,(int *)uRes,pCover);
      pwVar8[1] = wVar4;
      *pwVar8 = wVar4;
      return;
    }
  }
  else {
    wVar5 = *uOnDc;
    uVar7 = uOnDc[1];
  }
  iVar2 = *pCover;
  wVar4 = Abc_Tt6IsopCover(wVar4 & ~uVar7,wVar5,6,(int *)uRes,pCover);
  lVar11 = (long)*pCover;
  wVar5 = Abc_Tt6IsopCover(~*uOnDc & uOn[1],uOnDc[1],6,(int *)uRes,pCover);
  iVar3 = *pCover;
  wVar6 = Abc_Tt6IsopCover(~wVar5 & uOn[1] | ~wVar4 & *uOn,uOnDc[1] & *uOnDc,6,(int *)uRes,pCover);
  uVar9 = wVar4 | wVar6;
  *pwVar8 = uVar9;
  uVar7 = wVar6 | wVar5;
  pwVar8[1] = uVar7;
  for (lVar10 = (long)iVar2; lVar10 < lVar11; lVar10 = lVar10 + 1) {
    pbVar1 = (byte *)((long)uRes + lVar10 * 4 + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  for (; lVar11 < iVar3; lVar11 = lVar11 + 1) {
    pbVar1 = (byte *)((long)uRes + lVar11 * 4 + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  if (((*uOn & ~uVar9) == 0) && ((uOn[1] & ~uVar7) == 0)) {
    if (((uVar9 & ~*uOnDc) == 0) && ((uVar7 & ~uOnDc[1]) == 0)) {
      return;
    }
    __assert_fail("(uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                  ,0x89f,"void Abc_Tt7IsopCover(word *, word *, int, word *, int *, int *)");
  }
  __assert_fail("(uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                ,0x89e,"void Abc_Tt7IsopCover(word *, word *, int, word *, int *, int *)");
}

Assistant:

static inline void Abc_Tt7IsopCover( word uOn[2], word uOnDc[2], int nVars, word uRes[2], int * pCover, int * pnCubes )
{
    if ( nVars <= 6 || (uOn[0] == uOn[1] && uOnDc[0] == uOnDc[1]) )
        uRes[0] = uRes[1] = Abc_Tt6IsopCover( uOn[0], uOnDc[0], Abc_MinInt(nVars, 6), pCover, pnCubes );
    else
    {
        word uRes0, uRes1, uRes2;
        int c, nBeg0, nEnd0, nEnd1;
        assert( nVars == 7 );
        // solve for cofactors
        nBeg0 = *pnCubes; 
        uRes0 = Abc_Tt6IsopCover( uOn[0] & ~uOnDc[1], uOnDc[0], 6, pCover, pnCubes );   
        nEnd0 = *pnCubes;
        uRes1 = Abc_Tt6IsopCover( uOn[1] & ~uOnDc[0], uOnDc[1], 6, pCover, pnCubes );   
        nEnd1 = *pnCubes;
        uRes2 = Abc_Tt6IsopCover( (uOn[0] & ~uRes0) | (uOn[1] & ~uRes1), uOnDc[0] & uOnDc[1], 6, pCover, pnCubes );
        // derive the final truth table
        uRes[0] = uRes2 | uRes0;
        uRes[1] = uRes2 | uRes1;
        for ( c = nBeg0; c < nEnd0; c++ )
            pCover[c] |= (1 << (2*6+0));
        for ( c = nEnd0; c < nEnd1; c++ )
            pCover[c] |= (1 << (2*6+1));
        assert( (uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 );
        assert( (uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 );
    }
}